

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::dump(iterator *this,ostream *os)

{
  bool bVar1;
  key_prefix_size kVar2;
  node_type nVar3;
  ostream *poVar4;
  undefined8 uVar5;
  void *pvVar6;
  __extent_storage<18446744073709551615UL> in_RCX;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  version_type local_c8;
  key_view local_c0;
  int local_b0;
  char local_a9;
  int local_a8;
  char local_a1;
  reference local_a0;
  node_ptr *np;
  value_type *e;
  ulong local_80;
  size_type level;
  stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
  tmp;
  __extent_storage<18446744073709551615UL> local_20;
  ostream *os_local;
  iterator *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    std::operator<<(os,"iter::stack:: empty\n");
  }
  else {
    std::operator<<(os,"keybuf=");
    join_0x00000010_0x00000000_ = detail::key_buffer::get_key_view(&this->keybuf_);
    key._M_extent._M_extent_value = in_RCX._M_extent_value;
    key._M_ptr = (pointer)local_20._M_extent_value;
    detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)os,
               (ostream *)
               tmp.c.
               super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node,key);
    std::operator<<(os,"\n");
    std::
    stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
    ::stack((stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
             *)&level,&this->stack_);
    local_80 = std::
               stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
               ::size((stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
                       *)&level);
    while( true ) {
      local_80 = local_80 - 1;
      bVar1 = std::
              stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
              ::empty((stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
                       *)&level);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_a0 = std::
                 stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
                 ::top((stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
                        *)&level);
      np = (node_ptr *)local_a0;
      poVar4 = std::operator<<(os,"iter::stack:: level = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_80);
      poVar4 = std::operator<<(poVar4,", key_byte=0x");
      uVar5 = std::ostream::operator<<(poVar4,std::hex);
      local_a1 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(uVar5,local_a1);
      local_a8 = (int)std::setw(2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_a8);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,(ulong)(byte)np[1].tagged_ptr);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
      poVar4 = std::operator<<(poVar4,", child_index=0x");
      uVar5 = std::ostream::operator<<(poVar4,std::hex);
      local_a9 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(uVar5,local_a9);
      local_b0 = (int)std::setw(2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_b0);
      pvVar6 = (void *)std::ostream::operator<<
                                 (poVar4,(ulong)*(byte *)((long)&np[1].tagged_ptr + 1));
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
      poVar4 = std::operator<<(poVar4,", prefix(");
      kVar2 = detail::key_prefix_snapshot::length((key_prefix_snapshot *)(np + 2));
      poVar4 = std::operator<<(poVar4,kVar2);
      std::operator<<(poVar4,")=");
      local_c0 = detail::key_prefix_snapshot::get_key_view((key_prefix_snapshot *)(np + 2));
      key_00._M_extent._M_extent_value = in_RCX._M_extent_value;
      key_00._M_ptr = (pointer)local_c0._M_extent._M_extent_value;
      detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                ((detail *)os,(ostream *)local_c0._M_ptr,key_00);
      std::operator<<(os,", version=");
      optimistic_lock::version_type::version_type(&local_c8,np[3].tagged_ptr);
      optimistic_lock::version_type::dump(&local_c8,os);
      std::operator<<(os,", ");
      detail::
      basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
      ::dump_node(os,(basic_node_ptr<unodb::detail::olc_node_header> *)local_a0,false);
      nVar3 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                        ((basic_node_ptr<unodb::detail::olc_node_header> *)local_a0);
      if (nVar3 != LEAF) {
        std::operator<<(os,'\n');
      }
      std::
      stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
      ::pop((stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
             *)&level);
    }
    std::
    stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
    ::~stack((stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
              *)&level);
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream& os) const {
      if (empty()) {
        os << "iter::stack:: empty\n";
        return;
      }
      // Dump the key buffer maintained by the iterator.
      os << "keybuf=";
      detail::dump_key(os, keybuf_.get_key_view());
      os << "\n";
      // Create a new stack and copy everything there.  Using the new
      // stack, print out the stack in top-bottom order.  This avoids
      // modifications to the existing stack for the iterator.
      auto tmp = stack_;
      auto level = tmp.size() - 1;
      while (!tmp.empty()) {
        const auto& e = tmp.top();
        const auto& np = e.node;
        os << "iter::stack:: level = " << level << ", key_byte=0x" << std::hex
           << std::setfill('0') << std::setw(2)
           << static_cast<uint64_t>(e.key_byte) << std::dec
           << ", child_index=0x" << std::hex << std::setfill('0')
           << std::setw(2) << static_cast<std::uint64_t>(e.child_index)
           << std::dec << ", prefix(" << e.prefix.length() << ")=";
        detail::dump_key(os, e.prefix.get_key_view());
        os << ", version=";
        optimistic_lock::version_type(e.version).dump(os);  // version tag.
        os << ", ";
        art_policy::dump_node(os, np, false /*recursive*/);  // node or leaf.
        if (np.type() != node_type::LEAF) os << '\n';
        tmp.pop();
        level--;
      }
    }